

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

array<unsigned_char,_16UL> __thiscall
wasm::ShellExternalInterface::load128(ShellExternalInterface *this,Address addr,Name memoryName)

{
  iterator iVar1;
  array<unsigned_char,_16UL> aVar2;
  undefined1 local_28 [8];
  Name memoryName_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  local_28 = memoryName.super_IString.str._M_len;
  iVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
          ::find(&(this->memories)._M_t,(key_type *)local_28);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->memories)._M_t._M_impl.super__Rb_tree_header) {
    aVar2._M_elems._8_8_ = *(undefined8 *)((long)&(iVar1._M_node[1]._M_left)->_M_parent + addr.addr)
    ;
    aVar2._M_elems._0_8_ = *(undefined8 *)((long)&(iVar1._M_node[1]._M_left)->_M_color + addr.addr);
    return (array<unsigned_char,_16UL>)aVar2._M_elems;
  }
  __assert_fail("it != memories.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/shell-interface.h"
                ,0xf8,
                "virtual std::array<uint8_t, 16> wasm::ShellExternalInterface::load128(Address, Name)"
               );
}

Assistant:

std::array<uint8_t, 16> load128(Address addr, Name memoryName) override {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    return memory.get<std::array<uint8_t, 16>>(addr);
  }